

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O1

void __thiscall
gl4cts::ShaderSubroutine::FunctionalTest18_19::FunctionalTest18_19
          (FunctionalTest18_19 *this,Context *context)

{
  tcu::TestCase::TestCase
            ((TestCase *)this,context->m_testCtx,
             "control_flow_and_returned_subroutine_values_used_as_subroutine_input",
             "Makes sure that calling a subroutine with argument value returned by another subroutine works correctly. Also checks that subroutine and subroutine uniforms work as expected when used in connection with control flow functions."
            );
  (this->super_TestCase).m_context = context;
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TestCase_0211ea70;
  this->m_has_test_passed = true;
  this->m_n_points_to_draw = 0x10;
  this->m_po_id = 0;
  this->m_po_subroutine_divide_by_two_location = 0xffffffff;
  this->m_po_subroutine_multiply_by_four_location = 0xffffffff;
  this->m_po_subroutine_returns_false_location = 0xffffffff;
  this->m_po_subroutine_returns_true_location = 0xffffffff;
  this->m_po_subroutine_uniform_bool_operator1 = -1;
  this->m_po_subroutine_uniform_bool_operator2 = -1;
  this->m_po_subroutine_uniform_vec4_processor1 = -1;
  this->m_po_subroutine_uniform_vec4_processor2 = -1;
  this->m_xfb_bo_id = 0;
  this->m_vao_id = 0;
  this->m_vs_id = 0;
  return;
}

Assistant:

FunctionalTest18_19::FunctionalTest18_19(deqp::Context& context)
	: TestCase(context, "control_flow_and_returned_subroutine_values_used_as_subroutine_input",
			   "Makes sure that calling a subroutine with argument value returned by "
			   "another subroutine works correctly. Also checks that subroutine and "
			   "subroutine uniforms work as expected when used in connection with control "
			   "flow functions.")
	, m_has_test_passed(true)
	, m_n_points_to_draw(16) /* arbitrary value */
	, m_po_id(0)
	, m_po_subroutine_divide_by_two_location(GL_INVALID_INDEX)
	, m_po_subroutine_multiply_by_four_location(GL_INVALID_INDEX)
	, m_po_subroutine_returns_false_location(GL_INVALID_INDEX)
	, m_po_subroutine_returns_true_location(GL_INVALID_INDEX)
	, m_po_subroutine_uniform_bool_operator1(-1)
	, m_po_subroutine_uniform_bool_operator2(-1)
	, m_po_subroutine_uniform_vec4_processor1(-1)
	, m_po_subroutine_uniform_vec4_processor2(-1)
	, m_xfb_bo_id(0)
	, m_vao_id(0)
	, m_vs_id(0)
{
	/* Left blank intentionally */
}